

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadSafeFramesQueue.hpp
# Opt level: O0

bool __thiscall
ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>::Pop
          (ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
           *this,pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *out)

{
  bool bVar1;
  reference __p;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *out_local;
  ThreadSafeFramesQueue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>
  *this_local;
  
  lock._M_device = (mutex_type *)out;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->mtx);
  bVar1 = std::
          queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
          ::empty(&this->
                   super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 );
  if (!bVar1) {
    __p = std::
          queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
          ::front(&this->
                   super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
                 );
    std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>::operator=
              ((pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_> *)lock._M_device,__p)
    ;
    std::
    queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
    ::pop(&this->
           super_queue<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::deque<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>,_std::allocator<std::pair<cv::Mat,_std::vector<cv::Mat,_std::allocator<cv::Mat>_>_>_>_>_>
         );
    cv::TickMeter::stop(&this->tm);
    cv::TickMeter::start(&this->tm);
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return this_local._7_1_;
}

Assistant:

bool Pop(T& out) noexcept {
    std::lock_guard<std::mutex> lock(mtx);
    //! if the queue is empty, just exit
    if (this->empty()) {
      return false;
    }
    //! get the first element, and remove it
    out = this->front();
    this->pop();
    //! stop the current timer
    tm.stop();
    //! start the next timer
    tm.start();
    //! return true, indicating successful pop
    return true;
  }